

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O3

string * from_errno_abi_cxx11_(void)

{
  uint uVar1;
  uint __val;
  long lVar2;
  uint uVar3;
  uint *puVar4;
  undefined8 *puVar5;
  long *plVar6;
  uint uVar7;
  long *plVar8;
  size_type *psVar9;
  ulong uVar10;
  string *in_RDI;
  uint __len;
  string __str;
  long *local_d0;
  undefined8 local_c8;
  long local_c0;
  undefined8 uStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"syserror{code = ","");
  puVar4 = (uint *)__errno_location();
  uVar1 = *puVar4;
  __val = -uVar1;
  if (0 < (int)uVar1) {
    __val = uVar1;
  }
  __len = 1;
  if (9 < __val) {
    uVar10 = (ulong)__val;
    uVar3 = 4;
    do {
      __len = uVar3;
      uVar7 = (uint)uVar10;
      if (uVar7 < 100) {
        __len = __len - 2;
        goto LAB_0013be6c;
      }
      if (uVar7 < 1000) {
        __len = __len - 1;
        goto LAB_0013be6c;
      }
      if (uVar7 < 10000) goto LAB_0013be6c;
      uVar10 = uVar10 / 10000;
      uVar3 = __len + 4;
    } while (99999 < uVar7);
    __len = __len + 1;
  }
LAB_0013be6c:
  local_90 = local_80;
  std::__cxx11::string::_M_construct((ulong)&local_90,(char)__len - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar1 >> 0x1f) + (long)local_90),__len,__val);
  uVar10 = 0xf;
  if (local_b0 != local_a0) {
    uVar10 = local_a0[0];
  }
  if (uVar10 < (ulong)(local_88 + local_a8)) {
    uVar10 = 0xf;
    if (local_90 != local_80) {
      uVar10 = local_80[0];
    }
    if ((ulong)(local_88 + local_a8) <= uVar10) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_b0);
      goto LAB_0013befd;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90);
LAB_0013befd:
  local_d0 = &local_c0;
  plVar6 = puVar5 + 2;
  if ((long *)*puVar5 == plVar6) {
    local_c0 = *plVar6;
    uStack_b8 = puVar5[3];
  }
  else {
    local_c0 = *plVar6;
    local_d0 = (long *)*puVar5;
  }
  local_c8 = puVar5[1];
  *puVar5 = plVar6;
  puVar5[1] = 0;
  *(undefined1 *)plVar6 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_d0);
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_60 = *plVar8;
    lStack_58 = plVar6[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar8;
    local_70 = (long *)*plVar6;
  }
  local_68 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  strerror(*puVar4);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_40 = *plVar8;
    lStack_38 = plVar6[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar8;
    local_50 = (long *)*plVar6;
  }
  local_48 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar9) {
    lVar2 = plVar6[3];
    (in_RDI->field_2)._M_allocated_capacity = *psVar9;
    *(long *)((long)&in_RDI->field_2 + 8) = lVar2;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)*plVar6;
    (in_RDI->field_2)._M_allocated_capacity = *psVar9;
  }
  in_RDI->_M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  return in_RDI;
}

Assistant:

std::string from_errno() {
  std::string out = std::string("syserror{code = ") + std::to_string(errno) + ", msg = " + strerror(errno) + "}";
  return out;
}